

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DigitsUtils.cpp
# Opt level: O1

void ReadSingleFileWithDigits
               (string *path,
               vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               *samples,vector<float,_std::allocator<float>_> *targets)

{
  int iVar1;
  iterator __position;
  char *__nptr;
  char cVar2;
  istream *piVar3;
  int *piVar4;
  undefined8 uVar5;
  float fVar6;
  vector<float,_std::allocator<float>_> params;
  float label;
  string param;
  string line;
  stringstream ss;
  ifstream file;
  vector<float,_std::allocator<float>_> local_438;
  float local_420;
  undefined4 uStack_41c;
  float local_414;
  char *local_410;
  undefined8 local_408;
  char local_400;
  undefined7 uStack_3ff;
  char *local_3f0;
  long local_3e8;
  char local_3e0;
  undefined7 uStack_3df;
  vector<float,std::allocator<float>> *local_3d0;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  *local_3c8;
  stringstream local_3c0 [16];
  ostream local_3b0 [112];
  ios_base local_340 [264];
  istream local_238 [520];
  
  local_3d0 = (vector<float,std::allocator<float>> *)targets;
  local_3c8 = samples;
  std::ifstream::ifstream(local_238,(string *)path,_S_in);
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 != '\0') {
    local_3f0 = &local_3e0;
    local_3e8 = 0;
    local_3e0 = '\0';
    while (piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                              (local_238,(string *)&local_3f0,'\n'),
          ((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) == 0) {
      std::__cxx11::stringstream::stringstream(local_3c0);
      std::__ostream_insert<char,std::char_traits<char>>(local_3b0,local_3f0,local_3e8);
      local_410 = &local_400;
      local_408 = 0;
      local_400 = '\0';
      local_438.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (float *)0x0;
      local_438.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_438.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish = (float *)0x0;
      while (piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                ((istream *)local_3c0,(string *)&local_410,','), __nptr = local_410,
            ((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) == 0) {
        piVar4 = __errno_location();
        iVar1 = *piVar4;
        *piVar4 = 0;
        fVar6 = strtof(__nptr,(char **)&local_420);
        if ((char *)CONCAT44(uStack_41c,local_420) == __nptr) {
          std::__throw_invalid_argument("stof");
LAB_00105e67:
          uVar5 = std::__throw_out_of_range("stof");
          if (local_3f0 != &local_3e0) {
            operator_delete(local_3f0,CONCAT71(uStack_3df,local_3e0) + 1);
          }
          std::ifstream::~ifstream(local_238);
          _Unwind_Resume(uVar5);
        }
        if (*piVar4 == 0) {
          *piVar4 = iVar1;
        }
        else if (*piVar4 == 0x22) goto LAB_00105e67;
        local_414 = fVar6;
        if (local_438.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_438.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                    (&local_438,
                     (iterator)
                     local_438.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish,&local_414);
        }
        else {
          *local_438.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish = fVar6;
          local_438.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_438.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
      }
      local_420 = local_438.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish[-1];
      local_438.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_438.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish + -1;
      std::
      vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ::push_back(local_3c8,&local_438);
      __position._M_current = *(float **)(local_3d0 + 8);
      if (__position._M_current == *(float **)(local_3d0 + 0x10)) {
        std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                  (local_3d0,__position,&local_420);
      }
      else {
        *__position._M_current = local_420;
        *(float **)(local_3d0 + 8) = __position._M_current + 1;
      }
      if (local_438.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_438.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_438.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_438.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_410 != &local_400) {
        operator_delete(local_410,CONCAT71(uStack_3ff,local_400) + 1);
      }
      std::__cxx11::stringstream::~stringstream(local_3c0);
      std::ios_base::~ios_base(local_340);
    }
    if (local_3f0 != &local_3e0) {
      operator_delete(local_3f0,CONCAT71(uStack_3df,local_3e0) + 1);
    }
  }
  std::ifstream::~ifstream(local_238);
  return;
}

Assistant:

void ReadSingleFileWithDigits( const std::string &path, std::vector<SPIKING_NN::Sample> &samples,
                               std::vector<float> &targets )
{
    std::ifstream file( path );
    if ( file.is_open()) {
        std::string line;
        while ( std::getline( file, line, '\n' )) {
            std::stringstream ss;
            ss << line;
            std::string param;
            std::vector<float> params;
            while ( std::getline( ss, param, ',' )) {
                params.push_back( std::stof( param ));
            }
            float label = params.back();
            params.pop_back();
            samples.push_back( params );
            targets.push_back( label );
        }
    }
}